

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

char * __thiscall btSoftBody::serialize(btSoftBody *this,void *dataBuffer,btSerializer *serializer)

{
  btScalar bVar1;
  uint uVar2;
  Material *pMVar3;
  Anchor *pAVar4;
  Cluster *pCVar5;
  Cluster **ppCVar6;
  Joint **ppJVar7;
  int i_5;
  int iVar8;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  Anchor *pAVar12;
  btMatrix3x3 *pbVar13;
  Joint *pJVar14;
  int i_7;
  Node *pNVar15;
  btTransform *pbVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  btVector3 *pbVar20;
  int *piVar21;
  long lVar22;
  long lVar23;
  btVector3 *pbVar24;
  ulong uVar25;
  long lVar26;
  int i_2;
  Link *pLVar27;
  Face *pFVar28;
  Tetra *pTVar29;
  long lVar30;
  float *pfVar31;
  long lVar32;
  undefined8 *puVar33;
  ulong uVar34;
  void *pvVar35;
  int i;
  btHashMap<btHashPtr,_int> m_nodeIndexMap;
  int local_dc;
  void *local_d8;
  long local_d0;
  anon_union_8_2_511b660c_for_btHashPtr_0 local_c8;
  long local_c0;
  ulong local_b8;
  btHashMap<btHashPtr,_int> local_b0;
  
  btCollisionObject::serialize(&this->super_btCollisionObject,dataBuffer,serializer);
  local_b0.m_hashTable.m_ownsMemory = true;
  local_b0.m_hashTable.m_data = (int *)0x0;
  local_b0.m_hashTable.m_size = 0;
  local_b0.m_hashTable.m_capacity = 0;
  local_b0.m_next.m_ownsMemory = true;
  local_b0.m_next.m_data = (int *)0x0;
  local_b0.m_next.m_size = 0;
  local_b0.m_next.m_capacity = 0;
  local_b0.m_valueArray.m_ownsMemory = true;
  local_b0.m_valueArray.m_data = (int *)0x0;
  local_b0.m_valueArray.m_size = 0;
  local_b0.m_valueArray.m_capacity = 0;
  local_b0.m_keyArray.m_ownsMemory = true;
  local_b0.m_keyArray.m_data = (btHashPtr *)0x0;
  local_b0.m_keyArray.m_size = 0;
  local_b0.m_keyArray.m_capacity = 0;
  iVar8 = (this->m_materials).m_size;
  *(int *)((long)dataBuffer + 0x158) = iVar8;
  local_d8 = dataBuffer;
  if (iVar8 == 0) {
    *(undefined8 *)((long)dataBuffer + 0x118) = 0;
  }
  else {
    lVar9 = (**(code **)(*(long *)serializer + 0x38))(serializer,&this->m_materials);
    *(long *)((long)dataBuffer + 0x118) = lVar9;
    if (lVar9 != 0) {
      uVar2 = *(uint *)((long)dataBuffer + 0x158);
      lVar9 = (**(code **)(*(long *)serializer + 0x20))(serializer,8,(ulong)uVar2);
      if (0 < (int)uVar2) {
        lVar22 = *(long *)(lVar9 + 8);
        uVar34 = 0;
        do {
          pMVar3 = (this->m_materials).m_data[uVar34];
          if (pMVar3 == (Material *)0x0) {
            uVar10 = 0;
          }
          else {
            uVar10 = (**(code **)(*(long *)serializer + 0x38))(serializer,pMVar3);
          }
          *(undefined8 *)(lVar22 + uVar34 * 8) = uVar10;
          lVar11 = (**(code **)(*(long *)serializer + 0x30))(serializer,pMVar3);
          if (lVar11 == 0) {
            lVar11 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x10,1);
            puVar33 = *(undefined8 **)(lVar11 + 8);
            *(int *)((long)puVar33 + 0xc) = pMVar3->m_flags;
            *puVar33 = *(undefined8 *)&pMVar3->m_kLST;
            *(btScalar *)(puVar33 + 1) = pMVar3->m_kVST;
            (**(code **)(*(long *)serializer + 0x28))
                      (serializer,lVar11,"SoftBodyMaterialData",0x544d4253,pMVar3);
          }
          uVar34 = uVar34 + 1;
        } while (uVar2 != uVar34);
      }
      (**(code **)(*(long *)serializer + 0x28))(serializer,lVar9,"SoftBodyMaterialData",0x59415241);
      dataBuffer = local_d8;
    }
  }
  iVar8 = (this->m_nodes).m_size;
  *(int *)((long)dataBuffer + 0x15c) = iVar8;
  if (iVar8 == 0) {
    *(undefined8 *)((long)dataBuffer + 0x120) = 0;
  }
  else {
    lVar9 = (**(code **)(*(long *)serializer + 0x38))(serializer,&this->m_nodes);
    *(long *)((long)dataBuffer + 0x120) = lVar9;
    if (lVar9 != 0) {
      iVar8 = *(int *)((long)dataBuffer + 0x15c);
      local_d0 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x68,iVar8);
      puVar33 = *(undefined8 **)(local_d0 + 8);
      local_dc = 0;
      if (0 < iVar8) {
        do {
          pNVar15 = (this->m_nodes).m_data;
          lVar9 = (long)local_dc;
          lVar22 = 0x10;
          do {
            *(undefined4 *)((long)puVar33 + lVar22 * 4 + -8) =
                 *(undefined4 *)
                  ((long)&(((Node *)(&pNVar15[lVar9].m_x + -1))->super_Feature).super_Element.m_tag
                  + lVar22 * 4);
            lVar22 = lVar22 + 1;
          } while (lVar22 != 0x14);
          *(btScalar *)((long)puVar33 + 0x5c) = pNVar15[lVar9].m_area;
          *(uint *)(puVar33 + 0xc) = -((byte)pNVar15[lVar9].field_0x70 & 1);
          *(btScalar *)(puVar33 + 0xb) = pNVar15[lVar9].m_im;
          if (pNVar15[lVar9].super_Feature.m_material == (Material *)0x0) {
            uVar10 = 0;
          }
          else {
            uVar10 = (**(code **)(*(long *)serializer + 0x38))();
            lVar9 = (long)local_dc;
            pNVar15 = (this->m_nodes).m_data;
          }
          *puVar33 = uVar10;
          local_c8.m_pointer = pNVar15 + lVar9;
          lVar9 = 0x14;
          do {
            *(undefined4 *)((long)puVar33 + lVar9 * 4 + -8) =
                 *(undefined4 *)((long)local_c8.m_pointer + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x18);
          lVar9 = 4;
          do {
            *(undefined4 *)((long)puVar33 + lVar9 * 4 + -8) =
                 *(undefined4 *)((long)local_c8.m_pointer + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 8);
          lVar9 = 8;
          do {
            *(undefined4 *)((long)puVar33 + lVar9 * 4 + -8) =
                 *(undefined4 *)((long)local_c8.m_pointer + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0xc);
          lVar9 = 0xc;
          do {
            *(undefined4 *)((long)puVar33 + lVar9 * 4 + -8) =
                 *(undefined4 *)((long)local_c8.m_pointer + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x10);
          btHashMap<btHashPtr,_int>::insert(&local_b0,(btHashPtr *)&local_c8,&local_dc);
          local_dc = local_dc + 1;
          puVar33 = puVar33 + 0xd;
        } while (local_dc < iVar8);
      }
      (**(code **)(*(long *)serializer + 0x28))(serializer,local_d0,"SoftBodyNodeData",0x444e4253);
      dataBuffer = local_d8;
    }
  }
  iVar8 = (this->m_links).m_size;
  *(int *)((long)dataBuffer + 0x160) = iVar8;
  if (iVar8 == 0) {
    *(undefined8 *)((long)dataBuffer + 0x128) = 0;
  }
  else {
    lVar9 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_links).m_data);
    *(long *)((long)dataBuffer + 0x128) = lVar9;
    if (lVar9 != 0) {
      uVar2 = *(uint *)((long)dataBuffer + 0x160);
      lVar9 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x18,(ulong)uVar2);
      pLVar27 = (this->m_links).m_data;
      if (0 < (int)uVar2) {
        piVar21 = (int *)(*(long *)(lVar9 + 8) + 0x14);
        lVar22 = 0;
        do {
          *piVar21 = -(*(byte *)((long)(&pLVar27->m_c3 + -1) + lVar22) & 1);
          if (*(long *)((long)pLVar27->m_n + lVar22 + -8) == 0) {
            uVar10 = 0;
          }
          else {
            uVar10 = (**(code **)(*(long *)serializer + 0x38))();
            pLVar27 = (this->m_links).m_data;
          }
          *(undefined8 *)(piVar21 + -5) = uVar10;
          lVar11 = *(long *)((long)pLVar27->m_n + lVar22);
          iVar8 = -1;
          iVar17 = -1;
          if (lVar11 != 0) {
            iVar17 = (int)((ulong)(lVar11 - (long)(this->m_nodes).m_data) >> 3) * -0x11111111;
          }
          piVar21[-3] = iVar17;
          lVar11 = *(long *)((long)pLVar27->m_n + lVar22 + 8);
          if (lVar11 != 0) {
            iVar8 = (int)((ulong)(lVar11 - (long)(this->m_nodes).m_data) >> 3) * -0x11111111;
          }
          piVar21[-2] = iVar8;
          piVar21[-1] = *(int *)((long)pLVar27->m_n + lVar22 + 0x10);
          lVar22 = lVar22 + 0x48;
          piVar21 = piVar21 + 6;
        } while ((ulong)uVar2 * 0x48 != lVar22);
      }
      (**(code **)(*(long *)serializer + 0x28))(serializer,lVar9,"SoftBodyLinkData",0x59415241);
    }
  }
  iVar8 = (this->m_faces).m_size;
  *(int *)((long)dataBuffer + 0x164) = iVar8;
  if (iVar8 == 0) {
    *(undefined8 *)((long)dataBuffer + 0x130) = 0;
  }
  else {
    lVar9 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_faces).m_data);
    *(long *)((long)dataBuffer + 0x130) = lVar9;
    if (lVar9 != 0) {
      uVar2 = *(uint *)((long)dataBuffer + 0x164);
      lVar9 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x28,(ulong)uVar2);
      pFVar28 = (this->m_faces).m_data;
      if (0 < (int)uVar2) {
        lVar22 = *(long *)(lVar9 + 8);
        lVar32 = 0x28;
        lVar11 = 0x10;
        uVar34 = 0;
        do {
          if (pFVar28[uVar34].super_Feature.m_material == (Material *)0x0) {
            uVar10 = 0;
          }
          else {
            uVar10 = (**(code **)(*(long *)serializer + 0x38))();
            pFVar28 = (this->m_faces).m_data;
          }
          *(undefined8 *)(lVar22 + 0x10) = uVar10;
          lVar18 = 0;
          do {
            *(undefined4 *)(lVar22 + lVar18 * 4) =
                 *(undefined4 *)((long)pFVar28->m_n + lVar18 * 4 + lVar32 + -0x10);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 4);
          pNVar15 = (this->m_nodes).m_data;
          lVar18 = 0;
          do {
            lVar23 = *(long *)((long)pFVar28->m_n + lVar18 * 8 + lVar11 + -0x10);
            if (lVar23 == 0) {
              iVar8 = -1;
            }
            else {
              iVar8 = (int)((ulong)(lVar23 - (long)pNVar15) >> 3) * -0x11111111;
            }
            *(int *)(lVar22 + 0x18 + lVar18 * 4) = iVar8;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          *(btScalar *)(lVar22 + 0x24) = pFVar28[uVar34].m_ra;
          uVar34 = uVar34 + 1;
          lVar22 = lVar22 + 0x28;
          lVar32 = lVar32 + 0x48;
          lVar11 = lVar11 + 0x48;
        } while (uVar34 != uVar2);
      }
      (**(code **)(*(long *)serializer + 0x28))(serializer,lVar9,"SoftBodyFaceData",0x59415241);
      dataBuffer = local_d8;
    }
  }
  iVar8 = (this->m_tetras).m_size;
  *(int *)((long)dataBuffer + 0x168) = iVar8;
  if (iVar8 == 0) {
    *(undefined8 *)((long)dataBuffer + 0x138) = 0;
  }
  else {
    lVar9 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_tetras).m_data);
    *(long *)((long)dataBuffer + 0x138) = lVar9;
    if (lVar9 != 0) {
      uVar2 = *(uint *)((long)dataBuffer + 0x168);
      lVar9 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x68,(ulong)uVar2);
      pTVar29 = (this->m_tetras).m_data;
      if (0 < (int)uVar2) {
        lVar22 = *(long *)(lVar9 + 8);
        lVar11 = 0x40;
        uVar34 = 0;
        do {
          pNVar15 = (this->m_nodes).m_data;
          lVar32 = (long)pTVar29->m_n + lVar11 + -0x10;
          lVar23 = 0;
          lVar18 = lVar22;
          do {
            lVar26 = 0;
            do {
              *(undefined4 *)(lVar18 + lVar26 * 4) = *(undefined4 *)(lVar32 + lVar26 * 4);
              lVar26 = lVar26 + 1;
            } while (lVar26 != 4);
            lVar26 = *(long *)((long)pTVar29 + lVar23 * 0x90 + 0x10);
            if (lVar26 == 0) {
              iVar8 = -1;
            }
            else {
              iVar8 = (int)((ulong)(lVar26 - (long)pNVar15) >> 3) * -0x11111111;
            }
            *(int *)(lVar22 + 0x48 + lVar23 * 4) = iVar8;
            lVar23 = lVar23 + 1;
            lVar18 = lVar18 + 0x10;
            lVar32 = lVar32 + 0x10;
          } while (lVar23 != 4);
          *(undefined8 *)(lVar22 + 0x5c) = *(undefined8 *)&pTVar29[uVar34].m_c1;
          if (pTVar29[uVar34].super_Feature.m_material == (Material *)0x0) {
            uVar10 = 0;
          }
          else {
            uVar10 = (**(code **)(*(long *)serializer + 0x38))();
            pTVar29 = (this->m_tetras).m_data;
          }
          *(undefined8 *)(lVar22 + 0x40) = uVar10;
          *(btScalar *)(lVar22 + 0x58) = pTVar29[uVar34].m_rv;
          uVar34 = uVar34 + 1;
          lVar22 = lVar22 + 0x68;
          lVar11 = lVar11 + 0x88;
        } while (uVar34 != uVar2);
      }
      (**(code **)(*(long *)serializer + 0x28))(serializer,lVar9,"SoftBodyTetraData",0x59415241);
      dataBuffer = local_d8;
    }
  }
  iVar8 = (this->m_anchors).m_size;
  *(int *)((long)dataBuffer + 0x16c) = iVar8;
  if (iVar8 == 0) {
    *(undefined8 *)((long)dataBuffer + 0x140) = 0;
  }
  else {
    lVar9 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_anchors).m_data);
    *(long *)((long)dataBuffer + 0x140) = lVar9;
    if (lVar9 != 0) {
      uVar2 = *(uint *)((long)dataBuffer + 0x16c);
      local_d0 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x60,(ulong)uVar2);
      if (0 < (int)uVar2) {
        lVar9 = *(long *)(local_d0 + 8);
        lVar32 = 0x24;
        lVar22 = 0x54;
        lVar11 = 8;
        uVar34 = 0;
        do {
          pAVar4 = (this->m_anchors).m_data;
          pAVar12 = pAVar4 + uVar34;
          lVar18 = (long)(pAVar4->m_local).m_floats + lVar32 + -8;
          lVar26 = 0;
          lVar23 = lVar9;
          do {
            lVar30 = 0;
            do {
              *(undefined4 *)(lVar23 + lVar30 * 4) = *(undefined4 *)(lVar18 + lVar30 * 4);
              lVar30 = lVar30 + 1;
            } while (lVar30 != 4);
            lVar26 = lVar26 + 1;
            lVar23 = lVar23 + 0x10;
            lVar18 = lVar18 + 0x10;
          } while (lVar26 != 3);
          lVar18 = 0;
          do {
            *(undefined4 *)(lVar9 + 0x30 + lVar18 * 4) =
                 *(undefined4 *)((long)(pAVar4->m_local).m_floats + lVar18 * 4 + lVar22 + -8);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 4);
          *(btScalar *)(lVar9 + 0x5c) = pAVar12->m_c2;
          lVar18 = 0;
          do {
            *(undefined4 *)(lVar9 + 0x40 + lVar18 * 4) =
                 *(undefined4 *)((long)(pAVar4->m_local).m_floats + lVar18 * 4 + lVar11 + -8);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 4);
          if (pAVar12->m_node == (Node *)0x0) {
            iVar8 = -1;
          }
          else {
            iVar8 = (int)((ulong)((long)pAVar12->m_node - (long)(this->m_nodes).m_data) >> 3) *
                    -0x11111111;
          }
          *(int *)(lVar9 + 0x58) = iVar8;
          if (pAVar12->m_body == (btRigidBody *)0x0) {
            uVar10 = 0;
          }
          else {
            uVar10 = (**(code **)(*(long *)serializer + 0x38))();
          }
          *(undefined8 *)(lVar9 + 0x50) = uVar10;
          uVar34 = uVar34 + 1;
          lVar9 = lVar9 + 0x60;
          lVar32 = lVar32 + 0x68;
          lVar22 = lVar22 + 0x68;
          lVar11 = lVar11 + 0x68;
        } while (uVar34 != uVar2);
      }
      (**(code **)(*(long *)serializer + 0x28))
                (serializer,local_d0,"SoftRigidAnchorData",0x59415241,(this->m_anchors).m_data);
      dataBuffer = local_d8;
    }
  }
  *(btScalar *)((long)dataBuffer + 0x194) = (this->m_cfg).kDF;
  *(btScalar *)((long)dataBuffer + 0x18c) = (this->m_cfg).kPR;
  *(_ *)((long)dataBuffer + 0x178) = (this->m_cfg).aeromodel;
  uVar10 = *(undefined8 *)&(this->m_cfg).diterations;
  *(undefined8 *)((long)dataBuffer + 0x1cc) = *(undefined8 *)&(this->m_cfg).viterations;
  *(undefined8 *)((long)dataBuffer + 0x1d4) = uVar10;
  bVar1 = (this->m_cfg).maxvolume;
  uVar10 = *(undefined8 *)&(this->m_cfg).kDG;
  *(undefined8 *)((long)dataBuffer + 0x17c) = *(undefined8 *)&(this->m_cfg).kVCF;
  *(undefined8 *)((long)dataBuffer + 0x184) = uVar10;
  *(int *)((long)dataBuffer + 0x1dc) = (this->m_cfg).collisions;
  *(btScalar *)((long)dataBuffer + 400) = (this->m_cfg).kVC;
  uVar10 = *(undefined8 *)&(this->m_cfg).kKHR;
  *(undefined8 *)((long)dataBuffer + 0x198) = *(undefined8 *)&(this->m_cfg).kMT;
  *(undefined8 *)((long)dataBuffer + 0x1a0) = uVar10;
  *(btScalar *)((long)dataBuffer + 0x1c8) = (this->m_cfg).timescale;
  *(btScalar *)((long)dataBuffer + 0x1c4) = bVar1;
  uVar10 = *(undefined8 *)&(this->m_cfg).kSKHR_CL;
  *(undefined8 *)((long)dataBuffer + 0x1a8) = *(undefined8 *)&(this->m_cfg).kAHR;
  *(undefined8 *)((long)dataBuffer + 0x1b0) = uVar10;
  *(undefined8 *)((long)dataBuffer + 0x1b8) = *(undefined8 *)&(this->m_cfg).kSR_SPLT_CL;
  *(btScalar *)((long)dataBuffer + 0x1c0) = (this->m_cfg).kSS_SPLT_CL;
  uVar10 = (**(code **)(*(long *)serializer + 0x38))(serializer,&this->m_pose);
  *(undefined8 *)((long)dataBuffer + 0x110) = uVar10;
  lVar11 = (**(code **)(*(long *)serializer + 0x20))(serializer,200,1);
  lVar22 = *(long *)(lVar11 + 8);
  pbVar13 = &(this->m_pose).m_aqq;
  lVar9 = lVar22 + 0x60;
  lVar32 = 0;
  do {
    lVar18 = 0;
    do {
      *(btScalar *)(lVar9 + lVar18 * 4) = pbVar13->m_el[0].m_floats[lVar18];
      lVar18 = lVar18 + 1;
    } while (lVar18 != 4);
    lVar32 = lVar32 + 1;
    lVar9 = lVar9 + 0x10;
    pbVar13 = (btMatrix3x3 *)(pbVar13->m_el + 1);
  } while (lVar32 != 3);
  *(uint *)(lVar22 + 0xbc) = (uint)(this->m_pose).m_bframe;
  *(uint *)(lVar22 + 0xb8) = (uint)(this->m_pose).m_bvolume;
  lVar9 = 0;
  do {
    *(btScalar *)(lVar22 + 0x90 + lVar9 * 4) = (this->m_pose).m_com.m_floats[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  iVar8 = (this->m_pose).m_pos.m_size;
  *(int *)(lVar22 + 0xb0) = iVar8;
  if (iVar8 == 0) {
    *(undefined8 *)(lVar22 + 0xa0) = 0;
  }
  else {
    uVar10 = (**(code **)(*(long *)serializer + 0x38))();
    uVar2 = *(uint *)(lVar22 + 0xb0);
    uVar34 = (ulong)uVar2;
    *(undefined8 *)(lVar22 + 0xa0) = uVar10;
    if (uVar34 != 0) {
      lVar9 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x10,uVar34);
      pbVar24 = (this->m_pose).m_pos.m_data;
      if (0 < (int)uVar2) {
        lVar32 = *(long *)(lVar9 + 8);
        uVar19 = 0;
        do {
          lVar18 = 0;
          do {
            *(btScalar *)(lVar32 + lVar18 * 4) = pbVar24->m_floats[lVar18];
            lVar18 = lVar18 + 1;
          } while (lVar18 != 4);
          uVar19 = uVar19 + 1;
          lVar32 = lVar32 + 0x10;
          pbVar24 = pbVar24 + 1;
        } while (uVar19 != uVar34);
      }
      (**(code **)(*(long *)serializer + 0x28))(serializer,lVar9,"btVector3FloatData");
    }
  }
  *(btScalar *)(lVar22 + 0xc0) = (this->m_pose).m_volume;
  pbVar13 = &(this->m_pose).m_rot;
  lVar32 = 0;
  lVar9 = lVar22;
  do {
    lVar18 = 0;
    do {
      *(btScalar *)(lVar9 + lVar18 * 4) = pbVar13->m_el[0].m_floats[lVar18];
      lVar18 = lVar18 + 1;
    } while (lVar18 != 4);
    lVar32 = lVar32 + 1;
    lVar9 = lVar9 + 0x10;
    pbVar13 = (btMatrix3x3 *)(pbVar13->m_el + 1);
  } while (lVar32 != 3);
  pbVar13 = &(this->m_pose).m_scl;
  lVar9 = lVar22 + 0x30;
  lVar32 = 0;
  do {
    lVar18 = 0;
    do {
      *(btScalar *)(lVar9 + lVar18 * 4) = pbVar13->m_el[0].m_floats[lVar18];
      lVar18 = lVar18 + 1;
    } while (lVar18 != 4);
    lVar32 = lVar32 + 1;
    lVar9 = lVar9 + 0x10;
    pbVar13 = (btMatrix3x3 *)(pbVar13->m_el + 1);
  } while (lVar32 != 3);
  iVar8 = (this->m_pose).m_wgh.m_size;
  *(int *)(lVar22 + 0xb4) = iVar8;
  if (iVar8 == 0) {
    *(undefined8 *)(lVar22 + 0xa8) = 0;
  }
  else {
    uVar10 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_pose).m_wgh.m_data);
    uVar2 = *(uint *)(lVar22 + 0xb4);
    uVar34 = (ulong)uVar2;
    *(undefined8 *)(lVar22 + 0xa8) = uVar10;
    if (uVar34 != 0) {
      lVar9 = (**(code **)(*(long *)serializer + 0x20))(serializer,4,uVar34);
      pfVar31 = (this->m_pose).m_wgh.m_data;
      if (0 < (int)uVar2) {
        lVar22 = *(long *)(lVar9 + 8);
        uVar19 = 0;
        do {
          *(float *)(lVar22 + uVar19 * 4) = pfVar31[uVar19];
          uVar19 = uVar19 + 1;
        } while (uVar34 != uVar19);
      }
      (**(code **)(*(long *)serializer + 0x28))(serializer,lVar9,"float",0x59415241);
    }
  }
  (**(code **)(*(long *)serializer + 0x28))
            (serializer,lVar11,"SoftBodyPoseData",0x59415241,&this->m_pose);
  pvVar35 = local_d8;
  iVar8 = (this->m_clusters).m_size;
  *(int *)((long)local_d8 + 0x170) = iVar8;
  if (iVar8 == 0) {
    *(undefined8 *)((long)local_d8 + 0x148) = 0;
  }
  else {
    uVar10 = (**(code **)(*(long *)serializer + 0x38))(serializer,*(this->m_clusters).m_data);
    uVar2 = *(uint *)((long)pvVar35 + 0x170);
    uVar34 = (ulong)uVar2;
    *(undefined8 *)((long)pvVar35 + 0x148) = uVar10;
    if (uVar34 != 0) {
      local_c0 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x168,uVar34);
      if (0 < (int)uVar2) {
        lVar11 = *(long *)(local_c0 + 8);
        lVar9 = lVar11 + 0x70;
        lVar22 = lVar11 + 0x40;
        uVar19 = 0;
        local_b8 = uVar34;
        do {
          pCVar5 = (this->m_clusters).m_data[uVar19];
          *(btScalar *)(lVar11 + 0x14c) = pCVar5->m_adamping;
          lVar32 = 0;
          do {
            *(btScalar *)(lVar11 + 0x100 + lVar32 * 4) = (pCVar5->m_av).m_floats[lVar32];
            lVar32 = lVar32 + 1;
          } while (lVar32 != 4);
          *(int *)(lVar11 + 0x164) = pCVar5->m_clusterIndex;
          *(uint *)(lVar11 + 0x160) = (uint)pCVar5->m_collide;
          lVar32 = 0;
          do {
            *(btScalar *)(lVar11 + 0xa0 + lVar32 * 4) = (pCVar5->m_com).m_floats[lVar32];
            lVar32 = lVar32 + 1;
          } while (lVar32 != 4);
          *(uint *)(lVar11 + 0x15c) = (uint)pCVar5->m_containsAnchor;
          lVar32 = 0;
          do {
            *(btScalar *)(lVar11 + 0xd0 + lVar32 * 4) = pCVar5->m_dimpulses[0].m_floats[lVar32];
            lVar32 = lVar32 + 1;
          } while (lVar32 != 4);
          lVar32 = 0;
          do {
            *(btScalar *)(lVar11 + 0xe0 + lVar32 * 4) = (pCVar5->m_lv).m_floats[lVar32 + -6];
            lVar32 = lVar32 + 1;
          } while (lVar32 != 4);
          pbVar16 = &pCVar5->m_framexform;
          lVar18 = 0;
          lVar32 = lVar11;
          do {
            lVar23 = 0;
            do {
              *(btScalar *)(lVar32 + lVar23 * 4) = (pbVar16->m_basis).m_el[0].m_floats[lVar23];
              lVar23 = lVar23 + 1;
            } while (lVar23 != 4);
            lVar18 = lVar18 + 1;
            lVar32 = lVar32 + 0x10;
            pbVar16 = (btTransform *)((pbVar16->m_basis).m_el + 1);
          } while (lVar18 != 3);
          lVar32 = 0;
          do {
            *(btScalar *)(lVar11 + 0x30 + lVar32 * 4) =
                 (pCVar5->m_framexform).m_origin.m_floats[lVar32];
            lVar32 = lVar32 + 1;
          } while (lVar32 != 4);
          *(undefined8 *)(lVar11 + 0x134) = *(undefined8 *)&pCVar5->m_idmass;
          pbVar13 = &pCVar5->m_invwi;
          lVar18 = 0;
          lVar32 = lVar9;
          do {
            lVar23 = 0;
            do {
              *(btScalar *)(lVar32 + lVar23 * 4) = pbVar13->m_el[0].m_floats[lVar23];
              lVar23 = lVar23 + 1;
            } while (lVar23 != 4);
            lVar18 = lVar18 + 1;
            lVar32 = lVar32 + 0x10;
            pbVar13 = (btMatrix3x3 *)(pbVar13->m_el + 1);
          } while (lVar18 != 3);
          *(btScalar *)(lVar11 + 0x148) = pCVar5->m_ldamping;
          pbVar13 = &pCVar5->m_locii;
          lVar18 = 0;
          lVar32 = lVar22;
          do {
            lVar23 = 0;
            do {
              *(btScalar *)(lVar32 + lVar23 * 4) = pbVar13->m_el[0].m_floats[lVar23];
              lVar23 = lVar23 + 1;
            } while (lVar23 != 4);
            lVar18 = lVar18 + 1;
            lVar32 = lVar32 + 0x10;
            pbVar13 = (btMatrix3x3 *)(pbVar13->m_el + 1);
          } while (lVar18 != 3);
          lVar32 = 0;
          do {
            *(btScalar *)(lVar11 + 0xf0 + lVar32 * 4) = (pCVar5->m_lv).m_floats[lVar32];
            lVar32 = lVar32 + 1;
          } while (lVar32 != 4);
          *(btScalar *)(lVar11 + 0x154) = pCVar5->m_maxSelfCollisionImpulse;
          uVar10 = *(undefined8 *)&pCVar5->m_adamping;
          *(undefined8 *)(lVar11 + 0x144) = *(undefined8 *)&pCVar5->m_ndamping;
          *(undefined8 *)(lVar11 + 0x14c) = uVar10;
          *(btScalar *)(lVar11 + 0x158) = pCVar5->m_selfCollisionImpulseFactor;
          iVar8 = (pCVar5->m_framerefs).m_size;
          *(int *)(lVar11 + 0x128) = iVar8;
          *(int *)(lVar11 + 0x130) = (pCVar5->m_masses).m_size;
          *(int *)(lVar11 + 300) = (pCVar5->m_nodes).m_size;
          *(int *)(lVar11 + 0x13c) = pCVar5->m_nvimpulses;
          lVar32 = 0;
          do {
            *(btScalar *)(lVar11 + 0xb0 + lVar32 * 4) = pCVar5->m_vimpulses[0].m_floats[lVar32];
            lVar32 = lVar32 + 1;
          } while (lVar32 != 4);
          lVar32 = 0;
          do {
            *(btScalar *)(lVar11 + 0xc0 + lVar32 * 4) = pCVar5->m_vimpulses[1].m_floats[lVar32];
            lVar32 = lVar32 + 1;
          } while (lVar32 != 4);
          *(int *)(lVar11 + 0x140) = pCVar5->m_ndimpulses;
          local_d0 = lVar22;
          if (iVar8 == 0) {
            *(undefined8 *)(lVar11 + 0x110) = 0;
          }
          else {
            lVar22 = (**(code **)(*(long *)serializer + 0x38))();
            *(long *)(lVar11 + 0x110) = lVar22;
            if (lVar22 != 0) {
              uVar2 = *(uint *)(lVar11 + 0x128);
              lVar22 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x10,(ulong)uVar2);
              ppCVar6 = (this->m_clusters).m_data;
              if ((int)uVar2 < 1) {
                pbVar24 = (ppCVar6[uVar19]->m_framerefs).m_data;
              }
              else {
                lVar32 = *(long *)(lVar22 + 8);
                pbVar24 = (ppCVar6[uVar19]->m_framerefs).m_data;
                uVar25 = 0;
                pbVar20 = pbVar24;
                do {
                  lVar18 = 0;
                  do {
                    *(btScalar *)(lVar32 + lVar18 * 4) = pbVar20->m_floats[lVar18];
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 4);
                  uVar25 = uVar25 + 1;
                  lVar32 = lVar32 + 0x10;
                  pbVar20 = pbVar20 + 1;
                } while (uVar25 != uVar2);
              }
              (**(code **)(*(long *)serializer + 0x28))
                        (serializer,lVar22,"btVector3FloatData",0x59415241,pbVar24);
            }
          }
          if (*(int *)(lVar11 + 0x130) == 0) {
            *(undefined8 *)(lVar11 + 0x120) = 0;
          }
          else {
            lVar22 = (**(code **)(*(long *)serializer + 0x38))();
            *(long *)(lVar11 + 0x120) = lVar22;
            if (lVar22 != 0) {
              uVar2 = *(uint *)(lVar11 + 0x130);
              lVar22 = (**(code **)(*(long *)serializer + 0x20))(serializer,4,(ulong)uVar2);
              ppCVar6 = (this->m_clusters).m_data;
              if ((int)uVar2 < 1) {
                pfVar31 = (ppCVar6[uVar19]->m_masses).m_data;
              }
              else {
                lVar32 = *(long *)(lVar22 + 8);
                pfVar31 = (ppCVar6[uVar19]->m_masses).m_data;
                uVar25 = 0;
                do {
                  *(float *)(lVar32 + uVar25 * 4) = pfVar31[uVar25];
                  uVar25 = uVar25 + 1;
                } while (uVar2 != uVar25);
              }
              (**(code **)(*(long *)serializer + 0x28))
                        (serializer,lVar22,"float",0x59415241,pfVar31);
            }
          }
          if (*(int *)(lVar11 + 300) == 0) {
            *(undefined8 *)(lVar11 + 0x118) = 0;
          }
          else {
            lVar22 = (**(code **)(*(long *)serializer + 0x38))();
            *(long *)(lVar11 + 0x118) = lVar22;
            if (lVar22 != 0) {
              uVar2 = *(uint *)(lVar11 + 0x130);
              lVar22 = (**(code **)(*(long *)serializer + 0x20))(serializer,4,(ulong)uVar2);
              if (0 < (int)uVar2) {
                lVar32 = *(long *)(lVar22 + 8);
                uVar34 = 0;
                do {
                  local_c8 = *(anon_union_8_2_511b660c_for_btHashPtr_0 *)
                              (((this->m_clusters).m_data[uVar19]->m_nodes).m_data + uVar34);
                  iVar8 = btHashMap<btHashPtr,_int>::findIndex(&local_b0,(btHashPtr *)&local_c8);
                  *(int *)(lVar32 + uVar34 * 4) = local_b0.m_valueArray.m_data[iVar8];
                  uVar34 = uVar34 + 1;
                } while (uVar2 != uVar34);
              }
              (**(code **)(*(long *)serializer + 0x28))
                        (serializer,lVar22,"int",0x59415241,
                         &(this->m_clusters).m_data[uVar19]->m_nodes);
              uVar34 = local_b8;
            }
          }
          uVar19 = uVar19 + 1;
          lVar11 = lVar11 + 0x168;
          lVar9 = lVar9 + 0x168;
          lVar22 = local_d0 + 0x168;
        } while (uVar19 != uVar34);
      }
      (**(code **)(*(long *)serializer + 0x28))
                (serializer,local_c0,"SoftBodyClusterData",0x59415241,*(this->m_clusters).m_data);
      pvVar35 = local_d8;
    }
  }
  iVar8 = (this->m_joints).m_size;
  *(int *)((long)pvVar35 + 0x174) = iVar8;
  if (iVar8 == 0) {
    *(undefined8 *)((long)pvVar35 + 0x150) = 0;
  }
  else {
    lVar9 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_joints).m_data);
    *(long *)((long)pvVar35 + 0x150) = lVar9;
    if (lVar9 != 0) {
      uVar2 = (this->m_joints).m_size;
      lVar9 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x70,(ulong)uVar2);
      if (0 < (int)uVar2) {
        puVar33 = *(undefined8 **)(lVar9 + 8);
        uVar34 = 0;
        do {
          iVar8 = (*(this->m_joints).m_data[uVar34]->_vptr_Joint[5])();
          *(int *)(puVar33 + 0xd) = iVar8;
          ppJVar7 = (this->m_joints).m_data;
          pJVar14 = ppJVar7[uVar34];
          lVar22 = 0;
          do {
            *(btScalar *)((long)puVar33 + lVar22 * 4 + 0x10) = pJVar14->m_refs[0].m_floats[lVar22];
            lVar22 = lVar22 + 1;
          } while (lVar22 != 4);
          lVar22 = 0;
          do {
            *(btScalar *)((long)puVar33 + lVar22 * 4 + 0x20) =
                 (pJVar14->m_drift).m_floats[lVar22 + -7];
            lVar22 = lVar22 + 1;
          } while (lVar22 != 4);
          puVar33[6] = *(undefined8 *)&pJVar14->m_cfm;
          *(btScalar *)(puVar33 + 7) = pJVar14->m_split;
          *(uint *)((long)puVar33 + 0x3c) = (uint)pJVar14->m_delete;
          puVar33[8] = 0;
          puVar33[9] = 0;
          puVar33[10] = 0;
          puVar33[0xb] = 0;
          *puVar33 = 0;
          puVar33[1] = 0;
          pJVar14 = ppJVar7[uVar34];
          if (pJVar14->m_bodies[0].m_soft != (Cluster *)0x0) {
            *(undefined4 *)(puVar33 + 0xc) = 1;
            uVar10 = (**(code **)(*(long *)serializer + 0x38))();
            *puVar33 = uVar10;
            pJVar14 = (this->m_joints).m_data[uVar34];
          }
          if (pJVar14->m_bodies[0].m_collisionObject != (btCollisionObject *)0x0) {
            *(undefined4 *)(puVar33 + 0xc) = 3;
            uVar10 = (**(code **)(*(long *)serializer + 0x38))();
            *puVar33 = uVar10;
            pJVar14 = (this->m_joints).m_data[uVar34];
          }
          if (pJVar14->m_bodies[0].m_rigid != (btRigidBody *)0x0) {
            *(undefined4 *)(puVar33 + 0xc) = 2;
            uVar10 = (**(code **)(*(long *)serializer + 0x38))();
            *puVar33 = uVar10;
            pJVar14 = (this->m_joints).m_data[uVar34];
          }
          if (pJVar14->m_bodies[1].m_soft != (Cluster *)0x0) {
            *(undefined4 *)((long)puVar33 + 100) = 1;
            uVar10 = (**(code **)(*(long *)serializer + 0x38))();
            puVar33[1] = uVar10;
            pJVar14 = (this->m_joints).m_data[uVar34];
          }
          if (pJVar14->m_bodies[1].m_collisionObject != (btCollisionObject *)0x0) {
            *(undefined4 *)((long)puVar33 + 100) = 3;
            uVar10 = (**(code **)(*(long *)serializer + 0x38))();
            puVar33[1] = uVar10;
            pJVar14 = (this->m_joints).m_data[uVar34];
          }
          if (pJVar14->m_bodies[1].m_rigid != (btRigidBody *)0x0) {
            *(undefined4 *)((long)puVar33 + 100) = 2;
            uVar10 = (**(code **)(*(long *)serializer + 0x38))();
            puVar33[1] = uVar10;
          }
          uVar34 = uVar34 + 1;
          puVar33 = puVar33 + 0xe;
        } while (uVar34 != uVar2);
      }
      (**(code **)(*(long *)serializer + 0x28))
                (serializer,lVar9,"btSoftBodyJointData",0x59415241,(this->m_joints).m_data);
    }
  }
  btAlignedObjectArray<btHashPtr>::~btAlignedObjectArray(&local_b0.m_keyArray);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_b0.m_valueArray);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_b0.m_next);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_b0.m_hashTable);
  return "btSoftBodyFloatData";
}

Assistant:

const char*	btSoftBody::serialize(void* dataBuffer, class btSerializer* serializer) const
{
	btSoftBodyData* sbd = (btSoftBodyData*) dataBuffer;

	btCollisionObject::serialize(&sbd->m_collisionObjectData, serializer);

	btHashMap<btHashPtr,int>	m_nodeIndexMap;

	sbd->m_numMaterials = m_materials.size();
	sbd->m_materials = sbd->m_numMaterials? (SoftBodyMaterialData**) serializer->getUniquePointer((void*)&m_materials): 0;

	if (sbd->m_materials)
	{
		int sz = sizeof(SoftBodyMaterialData*);
		int numElem = sbd->m_numMaterials;
		btChunk* chunk = serializer->allocate(sz,numElem);
		//SoftBodyMaterialData** memPtr = chunk->m_oldPtr;
		SoftBodyMaterialData** memPtr = (SoftBodyMaterialData**)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			btSoftBody::Material* mat = m_materials[i];
			*memPtr = mat ? (SoftBodyMaterialData*)serializer->getUniquePointer((void*)mat) : 0;
			if (!serializer->findPointer(mat))
			{
				//serialize it here
				btChunk* chunk = serializer->allocate(sizeof(SoftBodyMaterialData),1);
				SoftBodyMaterialData* memPtr = (SoftBodyMaterialData*)chunk->m_oldPtr;
				memPtr->m_flags = mat->m_flags;
				memPtr->m_angularStiffness = mat->m_kAST;
				memPtr->m_linearStiffness = mat->m_kLST;
				memPtr->m_volumeStiffness = mat->m_kVST;
				serializer->finalizeChunk(chunk,"SoftBodyMaterialData",BT_SBMATERIAL_CODE,mat);
			}
		}
		serializer->finalizeChunk(chunk,"SoftBodyMaterialData",BT_ARRAY_CODE,(void*) &m_materials);
	}


	

	sbd->m_numNodes = m_nodes.size();
	sbd->m_nodes = sbd->m_numNodes ? (SoftBodyNodeData*)serializer->getUniquePointer((void*)&m_nodes): 0;
	if (sbd->m_nodes)
	{
		int sz = sizeof(SoftBodyNodeData);
		int numElem = sbd->m_numNodes;
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftBodyNodeData* memPtr = (SoftBodyNodeData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			m_nodes[i].m_f.serializeFloat( memPtr->m_accumulatedForce);
			memPtr->m_area = m_nodes[i].m_area;
			memPtr->m_attach = m_nodes[i].m_battach;
			memPtr->m_inverseMass = m_nodes[i].m_im;
			memPtr->m_material = m_nodes[i].m_material? (SoftBodyMaterialData*)serializer->getUniquePointer((void*) m_nodes[i].m_material):0;
			m_nodes[i].m_n.serializeFloat(memPtr->m_normal);
			m_nodes[i].m_x.serializeFloat(memPtr->m_position);
			m_nodes[i].m_q.serializeFloat(memPtr->m_previousPosition);
			m_nodes[i].m_v.serializeFloat(memPtr->m_velocity);
			m_nodeIndexMap.insert(&m_nodes[i],i);
		}
		serializer->finalizeChunk(chunk,"SoftBodyNodeData",BT_SBNODE_CODE,(void*) &m_nodes);
	}

	sbd->m_numLinks = m_links.size();
	sbd->m_links = sbd->m_numLinks? (SoftBodyLinkData*) serializer->getUniquePointer((void*)&m_links[0]):0;
	if (sbd->m_links)
	{
		int sz = sizeof(SoftBodyLinkData);
		int numElem = sbd->m_numLinks;
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftBodyLinkData* memPtr = (SoftBodyLinkData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_bbending = m_links[i].m_bbending;
			memPtr->m_material = m_links[i].m_material? (SoftBodyMaterialData*)serializer->getUniquePointer((void*) m_links[i].m_material):0;
			memPtr->m_nodeIndices[0] = m_links[i].m_n[0] ? m_links[i].m_n[0] - &m_nodes[0]: -1;
			memPtr->m_nodeIndices[1] = m_links[i].m_n[1] ? m_links[i].m_n[1] - &m_nodes[0]: -1;
			btAssert(memPtr->m_nodeIndices[0]<m_nodes.size());
			btAssert(memPtr->m_nodeIndices[1]<m_nodes.size());
			memPtr->m_restLength = m_links[i].m_rl;
		}
		serializer->finalizeChunk(chunk,"SoftBodyLinkData",BT_ARRAY_CODE,(void*) &m_links[0]);

	}


	sbd->m_numFaces = m_faces.size();
	sbd->m_faces = sbd->m_numFaces? (SoftBodyFaceData*) serializer->getUniquePointer((void*)&m_faces[0]):0;
	if (sbd->m_faces)
	{
		int sz = sizeof(SoftBodyFaceData);
		int numElem = sbd->m_numFaces;
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftBodyFaceData* memPtr = (SoftBodyFaceData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_material = m_faces[i].m_material ?  (SoftBodyMaterialData*) serializer->getUniquePointer((void*)m_faces[i].m_material): 0;
			m_faces[i].m_normal.serializeFloat(	memPtr->m_normal);
			for (int j=0;j<3;j++)
			{
				memPtr->m_nodeIndices[j] = m_faces[i].m_n[j]? m_faces[i].m_n[j] - &m_nodes[0]: -1;
			}
			memPtr->m_restArea = m_faces[i].m_ra;
		}
		serializer->finalizeChunk(chunk,"SoftBodyFaceData",BT_ARRAY_CODE,(void*) &m_faces[0]);
	}


	sbd->m_numTetrahedra = m_tetras.size();
	sbd->m_tetrahedra = sbd->m_numTetrahedra ? (SoftBodyTetraData*) serializer->getUniquePointer((void*)&m_tetras[0]):0;
	if (sbd->m_tetrahedra)
	{
		int sz = sizeof(SoftBodyTetraData);
		int numElem = sbd->m_numTetrahedra;
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftBodyTetraData* memPtr = (SoftBodyTetraData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			for (int j=0;j<4;j++)
			{
				m_tetras[i].m_c0[j].serializeFloat(	memPtr->m_c0[j] );
				memPtr->m_nodeIndices[j] = m_tetras[j].m_n[j]? m_tetras[j].m_n[j]-&m_nodes[0] : -1;
			}
			memPtr->m_c1 = m_tetras[i].m_c1;
			memPtr->m_c2 = m_tetras[i].m_c2;
			memPtr->m_material = m_tetras[i].m_material ? (SoftBodyMaterialData*)serializer->getUniquePointer((void*) m_tetras[i].m_material): 0;
			memPtr->m_restVolume = m_tetras[i].m_rv;
		}
		serializer->finalizeChunk(chunk,"SoftBodyTetraData",BT_ARRAY_CODE,(void*) &m_tetras[0]);
	}

	sbd->m_numAnchors = m_anchors.size();
	sbd->m_anchors = sbd->m_numAnchors ? (SoftRigidAnchorData*) serializer->getUniquePointer((void*)&m_anchors[0]):0;
	if (sbd->m_anchors)
	{
		int sz = sizeof(SoftRigidAnchorData);
		int numElem = sbd->m_numAnchors;
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftRigidAnchorData* memPtr = (SoftRigidAnchorData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			m_anchors[i].m_c0.serializeFloat(memPtr->m_c0);
			m_anchors[i].m_c1.serializeFloat(memPtr->m_c1);
			memPtr->m_c2 = m_anchors[i].m_c2;
			m_anchors[i].m_local.serializeFloat(memPtr->m_localFrame);
			memPtr->m_nodeIndex = m_anchors[i].m_node? m_anchors[i].m_node-&m_nodes[0]: -1;
			
			memPtr->m_rigidBody = m_anchors[i].m_body? (btRigidBodyData*)  serializer->getUniquePointer((void*)m_anchors[i].m_body): 0;
			btAssert(memPtr->m_nodeIndex < m_nodes.size());
		}
		serializer->finalizeChunk(chunk,"SoftRigidAnchorData",BT_ARRAY_CODE,(void*) &m_anchors[0]);
	}
	

	sbd->m_config.m_dynamicFriction = m_cfg.kDF;
	sbd->m_config.m_baumgarte = m_cfg.kVCF;
	sbd->m_config.m_pressure = m_cfg.kPR;
	sbd->m_config.m_aeroModel = this->m_cfg.aeromodel;
	sbd->m_config.m_lift = m_cfg.kLF;
	sbd->m_config.m_drag = m_cfg.kDG;
	sbd->m_config.m_positionIterations = m_cfg.piterations;
	sbd->m_config.m_driftIterations = m_cfg.diterations;
	sbd->m_config.m_clusterIterations = m_cfg.citerations;
	sbd->m_config.m_velocityIterations = m_cfg.viterations;
	sbd->m_config.m_maxVolume = m_cfg.maxvolume;
	sbd->m_config.m_damping = m_cfg.kDP;
	sbd->m_config.m_poseMatch = m_cfg.kMT;
	sbd->m_config.m_collisionFlags = m_cfg.collisions;
	sbd->m_config.m_volume = m_cfg.kVC;
	sbd->m_config.m_rigidContactHardness = m_cfg.kCHR;
	sbd->m_config.m_kineticContactHardness = m_cfg.kKHR;
	sbd->m_config.m_softContactHardness = m_cfg.kSHR;
	sbd->m_config.m_anchorHardness = m_cfg.kAHR;
	sbd->m_config.m_timeScale = m_cfg.timescale;
	sbd->m_config.m_maxVolume = m_cfg.maxvolume;
	sbd->m_config.m_softRigidClusterHardness = m_cfg.kSRHR_CL;
	sbd->m_config.m_softKineticClusterHardness = m_cfg.kSKHR_CL;
	sbd->m_config.m_softSoftClusterHardness = m_cfg.kSSHR_CL;
	sbd->m_config.m_softRigidClusterImpulseSplit = m_cfg.kSR_SPLT_CL;
	sbd->m_config.m_softKineticClusterImpulseSplit = m_cfg.kSK_SPLT_CL;
	sbd->m_config.m_softSoftClusterImpulseSplit = m_cfg.kSS_SPLT_CL;

	//pose for shape matching
	{
		sbd->m_pose = (SoftBodyPoseData*)serializer->getUniquePointer((void*)&m_pose);

		int sz = sizeof(SoftBodyPoseData);
		btChunk* chunk = serializer->allocate(sz,1);
		SoftBodyPoseData* memPtr = (SoftBodyPoseData*)chunk->m_oldPtr;
		
		m_pose.m_aqq.serializeFloat(memPtr->m_aqq);
		memPtr->m_bframe = m_pose.m_bframe;
		memPtr->m_bvolume = m_pose.m_bvolume;
		m_pose.m_com.serializeFloat(memPtr->m_com);
		
		memPtr->m_numPositions = m_pose.m_pos.size();
		memPtr->m_positions = memPtr->m_numPositions ? (btVector3FloatData*)serializer->getUniquePointer((void*)&m_pose.m_pos[0]): 0;
		if (memPtr->m_numPositions)
		{
			int numElem = memPtr->m_numPositions;
			int sz = sizeof(btVector3Data);
			btChunk* chunk = serializer->allocate(sz,numElem);
			btVector3FloatData* memPtr = (btVector3FloatData*)chunk->m_oldPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_pose.m_pos[i].serializeFloat(*memPtr);
			}
			serializer->finalizeChunk(chunk,"btVector3FloatData",BT_ARRAY_CODE,(void*)&m_pose.m_pos[0]);
		}
		memPtr->m_restVolume = m_pose.m_volume;
		m_pose.m_rot.serializeFloat(memPtr->m_rot);
		m_pose.m_scl.serializeFloat(memPtr->m_scale);

		memPtr->m_numWeigts = m_pose.m_wgh.size();
		memPtr->m_weights = memPtr->m_numWeigts? (float*) serializer->getUniquePointer((void*) &m_pose.m_wgh[0]) : 0;
		if (memPtr->m_numWeigts)
		{
			
			int numElem = memPtr->m_numWeigts;
			int sz = sizeof(float);
			btChunk* chunk = serializer->allocate(sz,numElem);
			float* memPtr = (float*) chunk->m_oldPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				*memPtr = m_pose.m_wgh[i];
			}
			serializer->finalizeChunk(chunk,"float",BT_ARRAY_CODE,(void*)&m_pose.m_wgh[0]);
		}

		serializer->finalizeChunk(chunk,"SoftBodyPoseData",BT_ARRAY_CODE,(void*)&m_pose);
	}

	//clusters for convex-cluster collision detection

	sbd->m_numClusters = m_clusters.size();
	sbd->m_clusters = sbd->m_numClusters? (SoftBodyClusterData*) serializer->getUniquePointer((void*)m_clusters[0]) : 0;
	if (sbd->m_numClusters)
	{
		int numElem = sbd->m_numClusters;
		int sz = sizeof(SoftBodyClusterData);
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftBodyClusterData* memPtr = (SoftBodyClusterData*) chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_adamping= m_clusters[i]->m_adamping;
			m_clusters[i]->m_av.serializeFloat(memPtr->m_av);
			memPtr->m_clusterIndex = m_clusters[i]->m_clusterIndex;
			memPtr->m_collide = m_clusters[i]->m_collide;
			m_clusters[i]->m_com.serializeFloat(memPtr->m_com);
			memPtr->m_containsAnchor = m_clusters[i]->m_containsAnchor;
			m_clusters[i]->m_dimpulses[0].serializeFloat(memPtr->m_dimpulses[0]);
			m_clusters[i]->m_dimpulses[1].serializeFloat(memPtr->m_dimpulses[1]);
			m_clusters[i]->m_framexform.serializeFloat(memPtr->m_framexform);
			memPtr->m_idmass = m_clusters[i]->m_idmass;
			memPtr->m_imass = m_clusters[i]->m_imass;
			m_clusters[i]->m_invwi.serializeFloat(memPtr->m_invwi);
			memPtr->m_ldamping = m_clusters[i]->m_ldamping;
			m_clusters[i]->m_locii.serializeFloat(memPtr->m_locii);
			m_clusters[i]->m_lv.serializeFloat(memPtr->m_lv);
			memPtr->m_matching = m_clusters[i]->m_matching;
			memPtr->m_maxSelfCollisionImpulse = m_clusters[i]->m_maxSelfCollisionImpulse;
			memPtr->m_ndamping = m_clusters[i]->m_ndamping;
			memPtr->m_ldamping = m_clusters[i]->m_ldamping;
			memPtr->m_adamping = m_clusters[i]->m_adamping;
			memPtr->m_selfCollisionImpulseFactor = m_clusters[i]->m_selfCollisionImpulseFactor;

			memPtr->m_numFrameRefs = m_clusters[i]->m_framerefs.size();
			memPtr->m_numMasses = m_clusters[i]->m_masses.size();
			memPtr->m_numNodes = m_clusters[i]->m_nodes.size();

			memPtr->m_nvimpulses = m_clusters[i]->m_nvimpulses;
			m_clusters[i]->m_vimpulses[0].serializeFloat(memPtr->m_vimpulses[0]);
			m_clusters[i]->m_vimpulses[1].serializeFloat(memPtr->m_vimpulses[1]);
			memPtr->m_ndimpulses = m_clusters[i]->m_ndimpulses;

			

			memPtr->m_framerefs = memPtr->m_numFrameRefs? (btVector3FloatData*)serializer->getUniquePointer((void*)&m_clusters[i]->m_framerefs[0]) : 0;
			if (memPtr->m_framerefs)
			{
				int numElem = memPtr->m_numFrameRefs;
				int sz = sizeof(btVector3FloatData);
				btChunk* chunk = serializer->allocate(sz,numElem);
				btVector3FloatData* memPtr = (btVector3FloatData*) chunk->m_oldPtr;
				for (int j=0;j<numElem;j++,memPtr++)
				{
					m_clusters[i]->m_framerefs[j].serializeFloat(*memPtr);
				}
				serializer->finalizeChunk(chunk,"btVector3FloatData",BT_ARRAY_CODE,(void*)&m_clusters[i]->m_framerefs[0]);
			}
			
			memPtr->m_masses = memPtr->m_numMasses ? (float*) serializer->getUniquePointer((void*)&m_clusters[i]->m_masses[0]): 0;
			if (memPtr->m_masses)
			{
				int numElem = memPtr->m_numMasses;
				int sz = sizeof(float);
				btChunk* chunk = serializer->allocate(sz,numElem);
				float* memPtr = (float*) chunk->m_oldPtr;
				for (int j=0;j<numElem;j++,memPtr++)
				{
					*memPtr = m_clusters[i]->m_masses[j];
				}
				serializer->finalizeChunk(chunk,"float",BT_ARRAY_CODE,(void*)&m_clusters[i]->m_masses[0]);
			}

			memPtr->m_nodeIndices  = memPtr->m_numNodes ? (int*) serializer->getUniquePointer((void*) &m_clusters[i]->m_nodes) : 0;
			if (memPtr->m_nodeIndices )
			{
				int numElem = memPtr->m_numMasses;
				int sz = sizeof(int);
				btChunk* chunk = serializer->allocate(sz,numElem);
				int* memPtr = (int*) chunk->m_oldPtr;
				for (int j=0;j<numElem;j++,memPtr++)
				{
					int* indexPtr = m_nodeIndexMap.find(m_clusters[i]->m_nodes[j]);
					btAssert(indexPtr);
					*memPtr = *indexPtr;
				}
				serializer->finalizeChunk(chunk,"int",BT_ARRAY_CODE,(void*)&m_clusters[i]->m_nodes);
			}
		}
		serializer->finalizeChunk(chunk,"SoftBodyClusterData",BT_ARRAY_CODE,(void*)m_clusters[0]);

	}
	

	
	sbd->m_numJoints = m_joints.size();
	sbd->m_joints = m_joints.size()? (btSoftBodyJointData*) serializer->getUniquePointer((void*)&m_joints[0]) : 0;

	if (sbd->m_joints)
	{
		int sz = sizeof(btSoftBodyJointData);
		int numElem = m_joints.size();
		btChunk* chunk = serializer->allocate(sz,numElem);
		btSoftBodyJointData* memPtr = (btSoftBodyJointData*)chunk->m_oldPtr;

		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_jointType = (int)m_joints[i]->Type();
			m_joints[i]->m_refs[0].serializeFloat(memPtr->m_refs[0]);
			m_joints[i]->m_refs[1].serializeFloat(memPtr->m_refs[1]);
			memPtr->m_cfm = m_joints[i]->m_cfm;
			memPtr->m_erp = float(m_joints[i]->m_erp);
			memPtr->m_split = float(m_joints[i]->m_split);
			memPtr->m_delete = m_joints[i]->m_delete;
			
			for (int j=0;j<4;j++)
			{
				memPtr->m_relPosition[0].m_floats[j] = 0.f;
				memPtr->m_relPosition[1].m_floats[j] = 0.f;
			}
			memPtr->m_bodyA = 0;
			memPtr->m_bodyB = 0;
			if (m_joints[i]->m_bodies[0].m_soft)
			{
				memPtr->m_bodyAtype = BT_JOINT_SOFT_BODY_CLUSTER;
				memPtr->m_bodyA = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[0].m_soft);
			}
			if (m_joints[i]->m_bodies[0].m_collisionObject)
			{
				memPtr->m_bodyAtype = BT_JOINT_COLLISION_OBJECT;
				memPtr->m_bodyA = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[0].m_collisionObject);
			}
			if (m_joints[i]->m_bodies[0].m_rigid)
			{
				memPtr->m_bodyAtype = BT_JOINT_RIGID_BODY;
				memPtr->m_bodyA = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[0].m_rigid);
			}

			if (m_joints[i]->m_bodies[1].m_soft)
			{
				memPtr->m_bodyBtype = BT_JOINT_SOFT_BODY_CLUSTER;
				memPtr->m_bodyB = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[1].m_soft);
			}
			if (m_joints[i]->m_bodies[1].m_collisionObject)
			{
				memPtr->m_bodyBtype = BT_JOINT_COLLISION_OBJECT;
				memPtr->m_bodyB = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[1].m_collisionObject);
			}
			if (m_joints[i]->m_bodies[1].m_rigid)
			{
				memPtr->m_bodyBtype = BT_JOINT_RIGID_BODY;
				memPtr->m_bodyB = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[1].m_rigid);
			}
		}
		serializer->finalizeChunk(chunk,"btSoftBodyJointData",BT_ARRAY_CODE,(void*) &m_joints[0]);
	}


	return btSoftBodyDataName;
}